

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

double Imath_3_2::anon_unknown_20::maxOffDiag<double>(Matrix44<double> *A)

{
  double *pdVar1;
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar2;
  int j;
  int i;
  double result;
  double local_20;
  int local_18;
  int local_14;
  double local_10;
  Matrix44<double> *local_8;
  
  local_10 = 0.0;
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      if (local_14 != local_18) {
        pMVar2 = local_8;
        Matrix44<double>::operator[](local_8,local_14);
        std::abs((int)pMVar2);
        pdVar1 = std::max<double>(&local_10,&local_20);
        local_10 = *pdVar1;
      }
    }
  }
  return local_10;
}

Assistant:

IMATH_CONSTEXPR14 T
maxOffDiag (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T result = 0;
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i != j) result = std::max (result, std::abs (A[i][j]));
        }
    }

    return result;
}